

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

void deqp::gles31::Functional::generateVariableTypeResourceNames
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *resources,string *name,VarType *type,deUint32 resourceNameGenerationFlags)

{
  Type TVar1;
  pointer pcVar2;
  StructType *pSVar3;
  uint resourceNameGenerationFlags_00;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_228;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  resourceNameGenerationFlags_00 = resourceNameGenerationFlags & 0xfffffffe;
  TVar1 = type->m_type;
  if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (type->m_data).structPtr;
    if (0 < (int)((ulong)((long)(pSVar3->m_members).
                                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar3->m_members).
                               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
      lVar10 = 0x20;
      lVar7 = 0;
      do {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        pcVar2 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,pcVar2,pcVar2 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_228);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_1a8[0].field_2._0_8_ = *psVar6;
          local_1a8[0].field_2._8_8_ = plVar5[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar6;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8[0]._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        generateVariableTypeResourceNames
                  (resources,local_1a8,
                   (VarType *)
                   ((long)&(((pSVar3->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus._M_p +
                   lVar10),resourceNameGenerationFlags_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + 1;
        lVar10 = lVar10 + 0x38;
      } while (lVar7 < (int)((ulong)((long)(pSVar3->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar3->m_members).
                                          super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x49249249);
    }
  }
  else if (TVar1 == TYPE_ARRAY) {
    TVar1 = ((type->m_data).array.elementType)->m_type;
    if ((resourceNameGenerationFlags & 2) != 0 && TVar1 == TYPE_BASIC) goto LAB_00674ac6;
    if ((resourceNameGenerationFlags & 1) == 0 && TVar1 != TYPE_BASIC) {
      if (0 < (type->m_data).array.size) {
        iVar9 = 0;
        do {
          pcVar2 = (name->_M_dataplus)._M_p;
          local_1c8 = local_1b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,pcVar2,pcVar2 + name->_M_string_length);
          std::__cxx11::string::append((char *)&local_1c8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<(local_1a8,iVar9);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar8 = 0xf;
          if (local_1c8 != local_1b8) {
            uVar8 = local_1b8[0];
          }
          if (uVar8 < (ulong)(local_1e0 + local_1c0)) {
            uVar8 = 0xf;
            if (local_1e8 != local_1d8) {
              uVar8 = local_1d8[0];
            }
            if (uVar8 < (ulong)(local_1e0 + local_1c0)) goto LAB_00674971;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_1c8)
            ;
          }
          else {
LAB_00674971:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1e8);
          }
          local_208 = &local_1f8;
          plVar5 = puVar4 + 2;
          if ((long *)*puVar4 == plVar5) {
            local_1f8 = *plVar5;
            uStack_1f0 = puVar4[3];
          }
          else {
            local_1f8 = *plVar5;
            local_208 = (long *)*puVar4;
          }
          local_200 = puVar4[1];
          *puVar4 = plVar5;
          puVar4[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_228.field_2._M_allocated_capacity = *psVar6;
            local_228.field_2._8_8_ = plVar5[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar6;
            local_228._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_228._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          generateVariableTypeResourceNames
                    (resources,&local_228,(type->m_data).array.elementType,
                     resourceNameGenerationFlags_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,local_1f8 + 1);
          }
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < (type->m_data).array.size);
      }
    }
    else {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar2,pcVar2 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_1a8);
      generateVariableTypeResourceNames
                (resources,local_1a8,(type->m_data).array.elementType,resourceNameGenerationFlags_00
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  else if (TVar1 == TYPE_BASIC) {
LAB_00674ac6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(resources,name);
    return;
  }
  return;
}

Assistant:

void generateVariableTypeResourceNames (std::vector<std::string>& resources, const std::string& name, const glu::VarType& type, deUint32 resourceNameGenerationFlags)
{
	DE_ASSERT((resourceNameGenerationFlags & (~RESOURCE_NAME_GENERATION_FLAG_MASK)) == 0);

	// remove top-level flag from children
	const deUint32 childFlags = resourceNameGenerationFlags & ~((deUint32)RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE);

	if (type.isBasicType())
		resources.push_back(name);
	else if (type.isStructType())
	{
		const glu::StructType* structType = type.getStructPtr();
		for (int ndx = 0; ndx < structType->getNumMembers(); ++ndx)
			generateVariableTypeResourceNames(resources, name + "." + structType->getMember(ndx).getName(), structType->getMember(ndx).getType(), childFlags);
	}
	else if (type.isArrayType())
	{
		// Bottom-level arrays of basic types of a transform feedback variable will produce only the first
		// element but without the trailing "[0]"
		if (type.getElementType().isBasicType() &&
			(resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TRANSFORM_FEEDBACK_VARIABLE) != 0)
		{
			resources.push_back(name);
		}
		// Bottom-level arrays of basic types and SSBO top-level arrays of any type procude only first element
		else if (type.getElementType().isBasicType() ||
				 (resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE) != 0)
		{
			generateVariableTypeResourceNames(resources, name + "[0]", type.getElementType(), childFlags);
		}
		// Other arrays of aggregate types are expanded
		else
		{
			for (int ndx = 0; ndx < type.getArraySize(); ++ndx)
				generateVariableTypeResourceNames(resources, name + "[" + de::toString(ndx) + "]", type.getElementType(), childFlags);
		}
	}
	else
		DE_ASSERT(false);
}